

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.c
# Opt level: O0

pchar * p_strchomp(pchar *str)

{
  size_t sVar1;
  ushort **ppuVar2;
  pchar *ppVar3;
  long lVar4;
  bool bVar5;
  byte *local_40;
  pchar *ptr;
  pchar *ret;
  psize str_len;
  pssize pos_end;
  pssize pos_start;
  pchar *str_local;
  
  if (str == (pchar *)0x0) {
    str_local = (pchar *)0x0;
  }
  else {
    pos_end = 0;
    sVar1 = strlen(str);
    str_len = sVar1 - 1;
    local_40 = (byte *)str;
    while( true ) {
      bVar5 = false;
      if (pos_end < (long)str_len) {
        ppuVar2 = __ctype_b_loc();
        bVar5 = ((*ppuVar2)[(int)(uint)*local_40] & 0x2000) != 0;
        local_40 = local_40 + 1;
      }
      if (!bVar5) break;
      pos_end = pos_end + 1;
    }
    local_40 = (byte *)(str + str_len);
    while( true ) {
      bVar5 = false;
      if (0 < (long)str_len) {
        ppuVar2 = __ctype_b_loc();
        bVar5 = ((*ppuVar2)[(int)(uint)*local_40] & 0x2000) != 0;
        local_40 = local_40 + -1;
      }
      if (!bVar5) break;
      str_len = str_len - 1;
    }
    if ((long)str_len < pos_end) {
      str_local = p_strdup("");
    }
    else {
      if ((str_len == pos_end) &&
         (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)str[str_len]] & 0x2000) != 0)) {
        ppVar3 = p_strdup("");
        return ppVar3;
      }
      lVar4 = str_len - pos_end;
      str_local = (pchar *)p_malloc0(lVar4 + 2);
      if (str_local == (pchar *)0x0) {
        str_local = (pchar *)0x0;
      }
      else {
        memcpy(str_local,str + pos_end,lVar4 + 1);
        str_local[lVar4 + 1] = '\0';
      }
    }
  }
  return str_local;
}

Assistant:

P_LIB_API pchar *
p_strchomp (const pchar *str)
{
	pssize		pos_start;
	pssize		pos_end;
	psize		str_len;
	pchar		*ret;
	const pchar	*ptr;

	if (P_UNLIKELY (str == NULL))
		return NULL;

	ptr       = str;
	pos_start = 0;
	pos_end   = ((pssize) strlen (str)) - 1;

	while (pos_start < pos_end && isspace (* ((const puchar *) ptr++)))
		++pos_start;

	ptr = str + pos_end;

	while (pos_end > 0 && isspace (* ((const puchar *) ptr--)))
		--pos_end;

	if (pos_end < pos_start)
		return p_strdup ("\0");

	if (pos_end == pos_start && isspace (* ((const puchar *) (str + pos_end))))
		return p_strdup ("\0");

	str_len = (psize) (pos_end - pos_start + 2);

	if (P_UNLIKELY ((ret = p_malloc0 (str_len)) == NULL))
		return NULL;

	memcpy (ret, str + pos_start, str_len - 1);
	*(ret + str_len - 1) = '\0';

	return ret;
}